

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::ColoredPrintf(GTestColor color,char *fmt,...)

{
  int iVar1;
  char *pcVar2;
  char *in_RSI;
  GTestColor in_EDI;
  bool use_color;
  va_list args;
  bool local_f2;
  undefined1 local_e8 [14];
  undefined1 in_stack_ffffffffffffff26;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_10;
  GTestColor local_4;
  
  local_18 = local_e8;
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  local_10 = in_RSI;
  local_4 = in_EDI;
  if ((ColoredPrintf(testing::internal::GTestColor,char_const*,...)::in_color_mode == '\0') &&
     (iVar1 = __cxa_guard_acquire(&ColoredPrintf(testing::internal::GTestColor,char_const*,...)::
                                   in_color_mode), iVar1 != 0)) {
    posix::FileNo((FILE *)0x1583a5);
    posix::IsATTY(0);
    ColoredPrintf::in_color_mode = ShouldUseColor((bool)in_stack_ffffffffffffff26);
    __cxa_guard_release(&ColoredPrintf(testing::internal::GTestColor,char_const*,...)::in_color_mode
                       );
  }
  local_f2 = (ColoredPrintf::in_color_mode & 1U) == 0 || local_4 == COLOR_DEFAULT;
  if (local_f2) {
    vprintf(local_10,&local_28);
  }
  else {
    pcVar2 = GetAnsiColorCode(local_4);
    printf("\x1b[0;3%sm",pcVar2);
    vprintf(local_10,&local_28);
    printf("\x1b[m");
  }
  return;
}

Assistant:

void ColoredPrintf(GTestColor color, const char* fmt, ...) {
  va_list args;
  va_start(args, fmt);

#if GTEST_OS_WINDOWS_MOBILE || GTEST_OS_SYMBIAN || GTEST_OS_ZOS || \
    GTEST_OS_IOS || GTEST_OS_WINDOWS_PHONE || GTEST_OS_WINDOWS_RT
  const bool use_color = AlwaysFalse();
#else
  static const bool in_color_mode =
      ShouldUseColor(posix::IsATTY(posix::FileNo(stdout)) != 0);
  const bool use_color = in_color_mode && (color != COLOR_DEFAULT);
#endif  // GTEST_OS_WINDOWS_MOBILE || GTEST_OS_SYMBIAN || GTEST_OS_ZOS
  // The '!= 0' comparison is necessary to satisfy MSVC 7.1.

  if (!use_color) {
    vprintf(fmt, args);
    va_end(args);
    return;
  }

#if GTEST_OS_WINDOWS && !GTEST_OS_WINDOWS_MOBILE && \
    !GTEST_OS_WINDOWS_PHONE && !GTEST_OS_WINDOWS_RT && !GTEST_OS_WINDOWS_MINGW
  const HANDLE stdout_handle = GetStdHandle(STD_OUTPUT_HANDLE);

  // Gets the current text color.
  CONSOLE_SCREEN_BUFFER_INFO buffer_info;
  GetConsoleScreenBufferInfo(stdout_handle, &buffer_info);
  const WORD old_color_attrs = buffer_info.wAttributes;
  const WORD new_color = GetNewColor(color, old_color_attrs);

  // We need to flush the stream buffers into the console before each
  // SetConsoleTextAttribute call lest it affect the text that is already
  // printed but has not yet reached the console.
  fflush(stdout);
  SetConsoleTextAttribute(stdout_handle, new_color);

  vprintf(fmt, args);

  fflush(stdout);
  // Restores the text color.
  SetConsoleTextAttribute(stdout_handle, old_color_attrs);
#else
  printf("\033[0;3%sm", GetAnsiColorCode(color));
  vprintf(fmt, args);
  printf("\033[m");  // Resets the terminal to default.
#endif  // GTEST_OS_WINDOWS && !GTEST_OS_WINDOWS_MOBILE
  va_end(args);
}